

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManPrintCo_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  ulong uVar2;
  Gia_Obj_t *pObj_00;
  
  uVar2 = *(ulong *)pObj & 0x1fffffff;
  if (uVar2 != 0x1fffffff && -1 < (int)*(ulong *)pObj) {
    Gia_ManPrintCo_rec(p,pObj + -uVar2);
    Gia_ManPrintCo_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    iVar1 = Gia_ObjIsMux(p,pObj);
    if (iVar1 != 0) {
      pObj_00 = Gia_ObjFanin2(p,pObj);
      Gia_ManPrintCo_rec(p,pObj_00);
    }
  }
  Gia_ObjPrint(p,pObj);
  return;
}

Assistant:

void Gia_ManPrintCo_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManPrintCo_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ManPrintCo_rec( p, Gia_ObjFanin1(pObj) );
        if ( Gia_ObjIsMux(p, pObj) )
            Gia_ManPrintCo_rec( p, Gia_ObjFanin2(p, pObj) );
    }
    Gia_ObjPrint( p, pObj );
}